

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

bool __thiscall setup::info::check_key(info *this,string *key)

{
  checksum *other;
  checksum_type type;
  EVP_PKEY_CTX *ctx;
  runtime_error *this_00;
  bool bVar1;
  char buffer [4];
  char nonce [24];
  xchacha20 cipher;
  uint32_t local_cc;
  anon_union_32_6_50477601_for_checksum_0 local_c8;
  xchacha20 local_a4;
  
  other = &(this->header).password;
  type = (this->header).password.type;
  if (type == PBKDF2_SHA256_XChaCha20) {
    if (key->_M_string_length != 0x38) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unexpected key size");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ctx = (EVP_PKEY_CTX *)(key->_M_dataplus)._M_p;
    local_c8._0_8_ = *(undefined8 *)(ctx + 0x20);
    local_c8._16_8_ = *(undefined8 *)(ctx + 0x30);
    local_c8._8_4_ = (undefined4)*(undefined8 *)(ctx + 0x28);
    local_c8._12_4_ = (undefined4)((ulong)*(undefined8 *)(ctx + 0x28) >> 0x20);
    local_c8._8_4_ = ~local_c8._8_4_;
    crypto::xchacha20::init(&local_a4,ctx);
    local_cc = 0;
    crypto::xchacha20::crypt(&local_a4,(char *)&local_cc,(char *)&local_cc);
    bVar1 = local_cc == (other->field_0).adler32;
  }
  else {
    crypto::hasher::hasher((hasher *)&local_a4,type);
    crypto::hasher::update
              ((hasher *)&local_a4,(this->header).password_salt._M_dataplus._M_p,
               (this->header).password_salt._M_string_length);
    crypto::hasher::update((hasher *)&local_a4,(key->_M_dataplus)._M_p,key->_M_string_length);
    crypto::hasher::finalize((checksum *)&local_c8,(hasher *)&local_a4);
    bVar1 = crypto::checksum::operator==((checksum *)&local_c8,other);
  }
  return bVar1;
}

Assistant:

bool info::check_key(const std::string & key) {
	
	if(header.password.type == crypto::PBKDF2_SHA256_XChaCha20) {
		
		#if INNOEXTRACT_HAVE_DECRYPTION
		
		if(key.length() != crypto::xchacha20::key_size + crypto::xchacha20::nonce_size) {
			throw std::runtime_error("unexpected key size");
		}
		
		crypto::xchacha20 cipher;
		
		char nonce[crypto::xchacha20::nonce_size];
		std::memcpy(nonce, key.c_str() + crypto::xchacha20::key_size, crypto::xchacha20::nonce_size);
		*reinterpret_cast<boost::uint32_t *>(nonce + 8) = ~*reinterpret_cast<boost::uint32_t *>(nonce + 8);
		cipher.init(key.c_str(), nonce);
		
		char buffer[] = { 0, 0, 0, 0 };
		cipher.crypt(buffer, buffer, sizeof(buffer));
		
		return (std::memcmp(buffer, header.password.check, sizeof(buffer)) == 0);
		
		#else
		throw std::runtime_error("XChaCha20 decryption not supported in this build");
		#endif
		
	} else {
		
		crypto::hasher checksum(header.password.type);
		checksum.update(header.password_salt.c_str(), header.password_salt.length());
		checksum.update(key.c_str(), key.length());
		return (checksum.finalize() == header.password);
		
	}
	
}